

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::EnsureLitbuf
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,CharCount size)

{
  uint uVar1;
  Char *pCVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->litbufLen;
  if (uVar1 - this->litbufNext < size) {
    uVar3 = 0x10;
    if (0x10 < uVar1) {
      uVar3 = this->litbufLen;
    }
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 * 2;
    } while (uVar4 < this->litbufNext + size);
    pCVar2 = (Char *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     Realloc(&this->ctAllocator->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,this->litbuf,(ulong)uVar1 * 2,(ulong)uVar4 * 2);
    this->litbuf = pCVar2;
    this->litbufLen = uVar4;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::EnsureLitbuf(CharCount size)
    {
        if (litbufLen - litbufNext < size)
        {
            CharCount newLen = max(litbufLen, initLitbufSize);
            while (newLen < litbufNext + size)
                newLen *= 2;
            litbuf = (Char*)ctAllocator->Realloc(litbuf, litbufLen * sizeof(Char), newLen * sizeof(Char));
            litbufLen = newLen;
        }
    }